

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

ClipFloat rr::anon_unknown_19::cliputil::getLineEndpointClipping(ClipVec4 *v0,ClipVec4 *v1)

{
  double dVar1;
  double dVar2;
  ClipFloat CVar3;
  
  dVar1 = v0->m_data[2];
  dVar2 = v0->m_data[3];
  if (dVar1 <= dVar2) {
    CVar3 = 0.0;
    if (dVar1 < -dVar2) {
      return (-dVar2 - dVar1) / ((v1->m_data[3] - dVar2) + (v1->m_data[2] - dVar1));
    }
  }
  else {
    CVar3 = (dVar2 - dVar1) / ((v1->m_data[2] - dVar1) - (v1->m_data[3] - dVar2));
  }
  return CVar3;
}

Assistant:

T						z			(void) const { DE_STATIC_ASSERT(Size >= 3); return m_data[2]; }